

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O2

string * __thiscall
Diligent::DeviceObjectArchive::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DeviceObjectArchive *this)

{
  undefined8 *puVar1;
  long *plVar2;
  __0 *p_Var3;
  long lVar4;
  bool bVar5;
  ostream *poVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  size_t sVar10;
  __node_base *p_Var11;
  ulong uVar12;
  vector<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_> *pvVar13;
  long lVar14;
  char *pcVar15;
  unsigned_long Number;
  Uint32 i;
  long *plVar16;
  __0 *p_Var17;
  pointer pSVar18;
  uint uVar19;
  ulong *puVar20;
  ulong *puVar21;
  pointer pSVar22;
  char Ident1 [3];
  char Ident2 [5];
  char CommonDataName [7];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ShaderNames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  char SeparatorLine [20];
  string msg;
  Serializer<(Diligent::SerializerMode)0> ShaderSer;
  array<std::vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>,_8UL>
  ResourcesByType;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream Output;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&Output);
  std::operator<<(local_1a8,"Archive contents:\n");
  builtin_strncpy(SeparatorLine,"------------------\n",0x14);
  Ident1[2] = '\0';
  Ident1[0] = ' ';
  Ident1[1] = ' ';
  builtin_strncpy(Ident2,"    ",5);
  poVar6 = std::operator<<(local_1a8,"Header\n");
  poVar6 = std::operator<<(poVar6,Ident1);
  poVar6 = std::operator<<(poVar6,"Archive version: ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  poVar6 = std::operator<<(poVar6,'\n');
  poVar6 = std::operator<<(poVar6,Ident1);
  poVar6 = std::operator<<(poVar6,"Content version: ");
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6,'\n');
  builtin_strncpy(CommonDataName,"Common",7);
  memset(&ResourcesByType,0,0xc0);
  p_Var11 = &(this->m_NamedResources)._M_h._M_before_begin;
  while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
    std::
    vector<std::reference_wrapper<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>const>,std::allocator<std::reference_wrapper<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>const>>>
    ::
    emplace_back<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>const&>
              ((vector<std::reference_wrapper<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>const>,std::allocator<std::reference_wrapper<std::pair<Diligent::DeviceObjectArchive::NamedResourceKey_const,Diligent::DeviceObjectArchive::ResourceData>const>>>
                *)(ResourcesByType._M_elems + (uint)*(size_type *)(p_Var11 + 1)),
               (pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>
                *)(p_Var11 + 1));
  }
  for (lVar9 = 0; lVar9 != 0xc0; lVar9 = lVar9 + 0x18) {
    puVar1 = *(undefined8 **)
              ((long)&ResourcesByType._M_elems[0].
                      super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar9);
    if (puVar1 != *(undefined8 **)
                   ((long)&ResourcesByType._M_elems[0].
                           super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish + lVar9)) {
      uVar19 = *(uint *)*puVar1;
      poVar6 = std::operator<<(local_1a8,SeparatorLine);
      if (uVar19 < 8) {
        pcVar15 = &DAT_007ebff4 + *(int *)(&DAT_007ebff4 + (ulong)uVar19 * 4);
      }
      else {
        FormatString<char[22]>(&msg,(char (*) [22])"Unexpected chunk type");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"ResourceTypeToString",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                   ,0x14f);
        std::__cxx11::string::~string((string *)&msg);
        pcVar15 = "";
      }
      poVar6 = std::operator<<(poVar6,pcVar15);
      poVar6 = std::operator<<(poVar6," (");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::operator<<(poVar6,")\n");
      plVar16 = *(long **)((long)&ResourcesByType._M_elems[0].
                                  super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar9);
      plVar2 = *(long **)((long)&ResourcesByType._M_elems[0].
                                 super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + lVar9);
      while( true ) {
        if (plVar16 == plVar2) break;
        lVar14 = *plVar16;
        poVar6 = std::operator<<(local_1a8,Ident1);
        poVar6 = std::operator<<(poVar6,*(char **)(lVar14 + 8));
        Number = 10;
        std::operator<<(poVar6,'\n');
        p_Var17 = *(__0 **)(lVar14 + 0x28);
        puVar21 = (ulong *)(lVar14 + 0x48);
        uVar12 = 6;
        puVar20 = puVar21;
        for (lVar14 = 0; lVar14 != 7; lVar14 = lVar14 + 1) {
          p_Var3 = (__0 *)*puVar20;
          if (p_Var17 <= p_Var3) {
            p_Var17 = p_Var3;
          }
          if (p_Var3 != (__0 *)0x0) {
            pcVar15 = anon_unknown_25::ArchiveDeviceTypeToString((Uint32)lVar14);
            sVar7 = strlen(pcVar15);
            if (uVar12 <= sVar7) {
              uVar12 = sVar7;
            }
          }
          puVar20 = puVar20 + 4;
        }
        sVar8 = const::$_0::operator()(p_Var17,Number);
        poVar6 = std::operator<<(local_1a8,Ident2);
        lVar14 = *(long *)poVar6;
        *(long *)(poVar6 + *(long *)(lVar14 + -0x18) + 0x10) = (long)(int)uVar12;
        lVar14 = *(long *)(lVar14 + -0x18);
        *(uint *)(poVar6 + lVar14 + 0x18) = *(uint *)(poVar6 + lVar14 + 0x18) & 0xffffff4f | 0x20;
        poVar6 = std::operator<<(poVar6,CommonDataName);
        poVar6 = std::operator<<(poVar6,' ');
        lVar14 = *(long *)poVar6;
        *(long *)(poVar6 + *(long *)(lVar14 + -0x18) + 0x10) = (long)(int)sVar8;
        lVar14 = *(long *)(lVar14 + -0x18);
        *(uint *)(poVar6 + lVar14 + 0x18) = *(uint *)(poVar6 + lVar14 + 0x18) & 0xffffff4f | 0x80;
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::operator<<(poVar6," bytes\n");
        for (lVar14 = 0; lVar14 != 7; lVar14 = lVar14 + 1) {
          if (*puVar21 != 0) {
            poVar6 = std::operator<<(local_1a8,Ident2);
            lVar4 = *(long *)poVar6;
            *(long *)(poVar6 + *(long *)(lVar4 + -0x18) + 0x10) = (long)(int)uVar12;
            lVar4 = *(long *)(lVar4 + -0x18);
            *(uint *)(poVar6 + lVar4 + 0x18) = *(uint *)(poVar6 + lVar4 + 0x18) & 0xffffff4f | 0x20;
            pcVar15 = anon_unknown_25::ArchiveDeviceTypeToString((Uint32)lVar14);
            poVar6 = std::operator<<(poVar6,pcVar15);
            poVar6 = std::operator<<(poVar6,' ');
            lVar4 = *(long *)poVar6;
            *(long *)(poVar6 + *(long *)(lVar4 + -0x18) + 0x10) = (long)(int)sVar8;
            lVar4 = *(long *)(lVar4 + -0x18);
            *(uint *)(poVar6 + lVar4 + 0x18) = *(uint *)(poVar6 + lVar4 + 0x18) & 0xffffff4f | 0x80;
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
            std::operator<<(poVar6," bytes\n");
          }
          puVar21 = puVar21 + 4;
        }
        plVar16 = plVar16 + 1;
      }
    }
  }
  std::
  array<std::vector<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>,_8UL>
  ::~array(&ResourcesByType);
  bVar5 = false;
  for (lVar9 = 0x40; lVar9 != 0xe8; lVar9 = lVar9 + 0x18) {
    bVar5 = (bool)(bVar5 | *(long *)((long)(this->m_DeviceShaders)._M_elems + lVar9 + -0x40) !=
                           *(long *)((long)(this->m_DeviceShaders)._M_elems + lVar9 + -0x38));
  }
  if (bVar5) {
    poVar6 = std::operator<<(local_1a8,SeparatorLine);
    std::operator<<(poVar6,"Compiled Shaders\n");
    for (lVar9 = 0; lVar9 != 7; lVar9 = lVar9 + 1) {
      if ((this->m_DeviceShaders)._M_elems[lVar9].
          super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (this->m_DeviceShaders)._M_elems[lVar9].
          super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        poVar6 = std::operator<<(local_1a8,Ident1);
        pcVar15 = anon_unknown_25::ArchiveDeviceTypeToString((Uint32)lVar9);
        poVar6 = std::operator<<(poVar6,pcVar15);
        poVar6 = std::operator<<(poVar6,'(');
        pvVar13 = (this->m_DeviceShaders)._M_elems + lVar9;
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::operator<<(poVar6,")\n");
        ShaderNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ShaderNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ShaderNames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pcVar15 = (char *)((long)(pvVar13->
                                 super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar13->
                                 super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 5);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve(&ShaderNames,(size_type)pcVar15);
        pSVar18 = (pvVar13->
                  super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        p_Var17 = (__0 *)0x0;
        uVar12 = 0;
        for (pSVar22 = (pvVar13->
                       super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                       )._M_impl.super__Vector_impl_data._M_start; pSVar22 != pSVar18;
            pSVar22 = pSVar22 + 1) {
          if (p_Var17 <= (__0 *)pSVar22->m_Size) {
            p_Var17 = (__0 *)pSVar22->m_Size;
          }
          ResourcesByType._M_elems[0].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ResourcesByType._M_elems[1].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ResourcesByType._M_elems[0].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ResourcesByType._M_elems[0].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ResourcesByType._M_elems[1].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ResourcesByType._M_elems[1].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x731172;
          ResourcesByType._M_elems[2].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ResourcesByType._M_elems[2].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
          ResourcesByType._M_elems[2].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ResourcesByType._M_elems[3].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
          ResourcesByType._M_elems[3].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._4_1_ = 0;
          ResourcesByType._M_elems[3].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x770729;
          ResourcesByType._M_elems[5].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_5_ = 0;
          ResourcesByType._M_elems[5].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._5_8_ = 0;
          ResourcesByType._M_elems[4].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          ResourcesByType._M_elems[4].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_5_ = 0;
          ResourcesByType._M_elems[4].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
          ResourcesByType._M_elems[3].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ResourcesByType._M_elems[4].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ResourcesByType._M_elems[5].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          ResourcesByType._M_elems[6].
          super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          ShaderSer.m_Start = (TPointer)pSVar22->m_Ptr;
          ShaderSer.m_End = ShaderSer.m_Start + pSVar22->m_Size;
          ShaderSer.m_Ptr = ShaderSer.m_Start;
          bVar5 = ShaderSerializer<(Diligent::SerializerMode)0>::SerializeCI
                            (&ShaderSer,(ConstQual<ShaderCreateInfo> *)&ResourcesByType);
          if (bVar5) {
            local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
            local_308.field_2._M_allocated_capacity._0_2_ = 0x27;
            local_308._M_string_length = 1;
            std::operator+(&local_1d8,&local_308,
                           (char *)ResourcesByType._M_elems[2].
                                   super__Vector_base<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::allocator<std::reference_wrapper<const_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::operator+(&msg,&local_1d8,'\'');
            pcVar15 = (char *)&msg;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &ShaderNames,&msg);
            std::__cxx11::string::~string((string *)&msg);
            std::__cxx11::string::~string((string *)&local_1d8);
            std::__cxx11::string::~string((string *)&local_308);
          }
          else {
            pcVar15 = "<Deserialization error>";
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[24]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &ShaderNames,(char (*) [24])"<Deserialization error>");
          }
          if (uVar12 <= ShaderNames.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length) {
            uVar12 = ShaderNames.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length;
          }
        }
        pSVar22 = (pvVar13->
                  super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pSVar18 = (pvVar13->
                  super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
        sVar8 = const::$_0::operator()
                          ((__0 *)((long)pSVar18 - (long)pSVar22 >> 5),(unsigned_long)pcVar15);
        sVar10 = const::$_0::operator()(p_Var17,(unsigned_long)pcVar15);
        for (uVar19 = 0; (ulong)uVar19 < (ulong)((long)pSVar18 - (long)pSVar22 >> 5);
            uVar19 = uVar19 + 1) {
          poVar6 = std::operator<<(local_1a8,Ident2);
          poVar6 = std::operator<<(poVar6,'[');
          lVar14 = *(long *)poVar6;
          *(long *)(poVar6 + *(long *)(lVar14 + -0x18) + 0x10) = (long)(int)sVar8;
          lVar14 = *(long *)(lVar14 + -0x18);
          *(uint *)(poVar6 + lVar14 + 0x18) = *(uint *)(poVar6 + lVar14 + 0x18) & 0xffffff4f | 0x80;
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          poVar6 = std::operator<<(poVar6,"] ");
          lVar14 = *(long *)poVar6;
          *(long *)(poVar6 + *(long *)(lVar14 + -0x18) + 0x10) = (long)(int)uVar12;
          lVar14 = *(long *)(lVar14 + -0x18);
          *(uint *)(poVar6 + lVar14 + 0x18) = *(uint *)(poVar6 + lVar14 + 0x18) & 0xffffff4f | 0x20;
          poVar6 = std::operator<<(poVar6,(string *)
                                          (ShaderNames.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + uVar19));
          poVar6 = std::operator<<(poVar6,' ');
          lVar14 = *(long *)poVar6;
          *(long *)(poVar6 + *(long *)(lVar14 + -0x18) + 0x10) = (long)(int)sVar10;
          lVar14 = *(long *)(lVar14 + -0x18);
          *(uint *)(poVar6 + lVar14 + 0x18) = *(uint *)(poVar6 + lVar14 + 0x18) & 0xffffff4f | 0x80;
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::operator<<(poVar6," bytes\n");
          pSVar22 = (pvVar13->
                    super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pSVar18 = (pvVar13->
                    super__Vector_base<Diligent::SerializedData,_std::allocator<Diligent::SerializedData>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&ShaderNames);
      }
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&Output);
  return __return_storage_ptr__;
}

Assistant:

std::string DeviceObjectArchive::ToString() const
{
    std::stringstream Output;
    Output << "Archive contents:\n";

    constexpr char SeparatorLine[] = "------------------\n";
    constexpr char Ident1[]        = "  ";
    constexpr char Ident2[]        = "    ";

    // Print header
    {
        Output << "Header\n"
               << Ident1 << "Archive version: " << ArchiveVersion << '\n'
               << Ident1 << "Content version: " << m_ContentVersion << '\n';
    }

    constexpr char CommonDataName[] = "Common";

    auto GetNumFieldWidth = [](auto Number) //
    {
        size_t Width = 1;
        for (; Number >= 10; Number /= 10)
            ++Width;
        return Width;
    };

    // Print resources, e.g.:
    //
    //   ------------------
    //   Resource Signatures (1)
    //     Test PRS
    //       Common     1015 bytes
    //       OpenGL      729 bytes
    //       Direct3D11  384 bytes
    //       Direct3D12  504 bytes
    //       Vulkan      881 bytes
    {
        std::array<std::vector<std::reference_wrapper<const decltype(m_NamedResources)::value_type>>, static_cast<size_t>(ResourceType::Count)> ResourcesByType;
        for (const auto& it : m_NamedResources)
        {
            ResourcesByType[static_cast<size_t>(it.first.GetType())].emplace_back(it);
        }

        for (const auto& Resources : ResourcesByType)
        {
            if (Resources.empty())
                continue;

            const auto ResType = Resources.front().get().first.GetType();
            Output << SeparatorLine
                   << ResourceTypeToString(ResType) << " (" << Resources.size() << ")\n";
            // ------------------
            // Resource Signatures (1)

            for (const auto& res_ref : Resources)
            {
                const auto& it = res_ref.get();
                Output << Ident1 << it.first.GetName() << '\n';
                // ..Test PRS

                const auto& Res = it.second;

                auto   MaxSize       = Res.Common.Size();
                size_t MaxDevNameLen = strlen(CommonDataName);
                for (Uint32 i = 0; i < Res.DeviceSpecific.size(); ++i)
                {
                    const auto DevDataSize = Res.DeviceSpecific[i].Size();

                    MaxSize = std::max(MaxSize, DevDataSize);
                    if (DevDataSize != 0)
                        MaxDevNameLen = std::max(MaxDevNameLen, strlen(ArchiveDeviceTypeToString(i)));
                }
                const auto SizeFieldW = GetNumFieldWidth(MaxSize);

                Output << Ident2 << std::setw(static_cast<int>(MaxDevNameLen)) << std::left << CommonDataName << ' '
                       << std::setw(static_cast<int>(SizeFieldW)) << std::right << Res.Common.Size() << " bytes\n";
                // ....Common     1015 bytes

                for (Uint32 i = 0; i < Res.DeviceSpecific.size(); ++i)
                {
                    const auto DevDataSize = Res.DeviceSpecific[i].Size();
                    if (DevDataSize > 0)
                    {
                        Output << Ident2 << std::setw(static_cast<int>(MaxDevNameLen)) << std::left << ArchiveDeviceTypeToString(i) << ' '
                               << std::setw(static_cast<int>(SizeFieldW)) << std::right << DevDataSize << " bytes\n";
                        // ....OpenGL      729 bytes
                    }
                }
            }
        }
    }

    // Print shaders, e.g.
    //
    //   ------------------
    //   Shaders
    //     OpenGL(2)
    //       [0] 'Test VS' 4020 bytes
    //       [1] 'Test PS' 4020 bytes
    //     Vulkan(2)
    //       [0] 'Test VS' 8364 bytes
    //       [1] 'Test PS' 7380 bytes
    {
        bool HasShaders = false;
        for (const auto& Shaders : m_DeviceShaders)
        {
            if (!Shaders.empty())
                HasShaders = true;
        }

        if (HasShaders)
        {
            Output << SeparatorLine
                   << "Compiled Shaders\n";
            // ------------------
            // Compiled Shaders

            for (Uint32 dev = 0; dev < m_DeviceShaders.size(); ++dev)
            {
                const auto& Shaders = m_DeviceShaders[dev];
                if (Shaders.empty())
                    continue;
                Output << Ident1 << ArchiveDeviceTypeToString(dev) << '(' << Shaders.size() << ")\n";
                // ..OpenGL(2)

                std::vector<std::string> ShaderNames;
                ShaderNames.reserve(Shaders.size());

                size_t MaxSize    = 0;
                size_t MaxNameLen = 0;
                for (const auto& ShaderData : Shaders)
                {
                    MaxSize = std::max(MaxSize, ShaderData.Size());

                    ShaderCreateInfo                 ShaderCI;
                    Serializer<SerializerMode::Read> ShaderSer{ShaderData};
                    if (ShaderSerializer<SerializerMode::Read>::SerializeCI(ShaderSer, ShaderCI))
                        ShaderNames.emplace_back(std::string{'\''} + ShaderCI.Desc.Name + '\'');
                    else
                        ShaderNames.emplace_back("<Deserialization error>");
                    MaxNameLen = std::max(MaxNameLen, ShaderNames.back().size());
                }

                const auto IdxFieldW  = GetNumFieldWidth(Shaders.size());
                const auto SizeFieldW = GetNumFieldWidth(MaxSize);
                for (Uint32 idx = 0; idx < Shaders.size(); ++idx)
                {
                    Output << Ident2 << '[' << std::setw(static_cast<int>(IdxFieldW)) << std::right << idx << "] "
                           << std::setw(static_cast<int>(MaxNameLen)) << std::left << ShaderNames[idx] << ' '
                           << std::setw(static_cast<int>(SizeFieldW)) << std::right << Shaders[idx].Size() << " bytes\n";
                    // ....[0] 'Test VS' 4020 bytes
                }
            }
        }
    }

    return Output.str();
}